

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_engine * adios2_open_with_metadata(adios2_io *io,char *name,char *md,size_t mdsize)

{
  adios2_engine *paVar1;
  allocator local_61;
  allocator local_60 [32];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for adios2_io, in call to adios2_open_with_metadata",local_60);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)local_60,name,&local_61);
  paVar1 = (adios2_engine *)adios2::core::IO::Open((string *)io,(char *)local_60,(ulong)md);
  std::__cxx11::string::~string((string *)local_60);
  return paVar1;
}

Assistant:

adios2_engine *adios2_open_with_metadata(adios2_io *io, const char *name, const char *md,
                                         const size_t mdsize)
{
    adios2_engine *engine = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_open_with_metadata");
        engine = reinterpret_cast<adios2_engine *>(
            &reinterpret_cast<adios2::core::IO *>(io)->Open(name, md, mdsize));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_open_with_metadata");
    }
    return engine;
}